

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O3

int drmp3_hdr_compare(drmp3_uint8 *h1,drmp3_uint8 *h2)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = drmp3_hdr_valid(h2);
  uVar2 = 0;
  if ((iVar1 != 0) && ((h2[1] ^ h1[1]) < 2)) {
    if (((h2[2] ^ h1[2]) & 0xc) == 0) {
      uVar2 = (uint)(0xf < h2[2] != h1[2] < 0x10);
    }
  }
  return uVar2;
}

Assistant:

static int drmp3_hdr_compare(const drmp3_uint8 *h1, const drmp3_uint8 *h2)
{
    return drmp3_hdr_valid(h2) &&
           ((h1[1] ^ h2[1]) & 0xFE) == 0 &&
           ((h1[2] ^ h2[2]) & 0x0C) == 0 &&
           !(DRMP3_HDR_IS_FREE_FORMAT(h1) ^ DRMP3_HDR_IS_FREE_FORMAT(h2));
}